

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgn_scanner.c
# Opt level: O0

int yylex_destroy(void)

{
  YY_BUFFER_STATE local_18;
  YY_BUFFER_STATE local_10;
  
  while( true ) {
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_10 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_10 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (local_10 == (YY_BUFFER_STATE)0x0) break;
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_18 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_18 = yy_buffer_stack[yy_buffer_stack_top];
    }
    yy_delete_buffer(local_18);
    yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    yypop_buffer_state();
  }
  yyfree(yy_buffer_stack);
  yy_buffer_stack = (YY_BUFFER_STATE *)0x0;
  yy_init_globals();
  return 0;
}

Assistant:

int yylex_destroy  (void)
{
    
    /* Pop the buffer stack, destroying each element. */
	while(YY_CURRENT_BUFFER){
		yy_delete_buffer( YY_CURRENT_BUFFER  );
		YY_CURRENT_BUFFER_LVALUE = NULL;
		yypop_buffer_state();
	}

	/* Destroy the stack itself. */
	yyfree((yy_buffer_stack) );
	(yy_buffer_stack) = NULL;

    /* Reset the globals. This is important in a non-reentrant scanner so the next time
     * yylex() is called, initialization will occur. */
    yy_init_globals( );

    return 0;
}